

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O3

void CoreML::Specification::CoreMLModels::protobuf_SoundAnalysisPreprocessing_2eproto::TableStruct::
     Shutdown(void)

{
  if (DAT_003cb560 == '\x01') {
    DAT_003cb560 = '\0';
    (*(code *)*_SoundAnalysisPreprocessing_Vggish_default_instance_)();
  }
  if (DAT_003cb588 == '\x01') {
    DAT_003cb588 = 0;
    (*(code *)*_SoundAnalysisPreprocessing_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _SoundAnalysisPreprocessing_Vggish_default_instance_.Shutdown();
  _SoundAnalysisPreprocessing_default_instance_.Shutdown();
}